

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateContextExtTests.cpp
# Opt level: O2

string * __thiscall
deqp::egl::(anonymous_namespace)::eglProfileMaskToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,EGLint mask)

{
  ostringstream stream;
  ostream oStack_188;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_188);
  if ((int)this == 0) {
    std::operator<<(&oStack_188,"<None>");
  }
  else {
    if (((ulong)this & 1) == 0) {
      if (((ulong)this & 2) == 0) goto LAB_00dd0e31;
    }
    else {
      std::operator<<(&oStack_188,"EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR");
      if (((ulong)this & 2) == 0) goto LAB_00dd0e31;
      std::operator<<(&oStack_188,"|");
    }
    std::operator<<(&oStack_188,"EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR");
  }
LAB_00dd0e31:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_188);
  return __return_storage_ptr__;
}

Assistant:

string eglProfileMaskToString (EGLint mask)
{
	std::ostringstream	stream;

	if (mask == 0)
		stream << "<None>";
	else
	{
		bool first = true;

		if ((mask & EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR) != 0)
		{
			if (!first)
				stream << "|";

			first = false;

			stream << "EGL_CONTEXT_OPENGL_CORE_PROFILE_BIT_KHR";
		}

		if ((mask & EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR) != 0)
		{
			if (!first)
				stream << "|";

			stream << "EGL_CONTEXT_OPENGL_COMPATIBILITY_PROFILE_BIT_KHR";
		}
	}

	return stream.str();
}